

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

void __thiscall phosg::Subprocess::Subprocess(Subprocess *this,Subprocess *other)

{
  Subprocess *other_local;
  Subprocess *this_local;
  
  this->stdin_write_fd = other->stdin_write_fd;
  this->stdout_read_fd = other->stdout_read_fd;
  this->stderr_read_fd = other->stderr_read_fd;
  this->child_pid = other->child_pid;
  this->terminated = (bool)(other->terminated & 1);
  this->exit_status = other->exit_status;
  other->stdin_write_fd = -1;
  other->stdout_read_fd = -1;
  other->stderr_read_fd = -1;
  other->child_pid = -1;
  other->terminated = true;
  return;
}

Assistant:

Subprocess::Subprocess(Subprocess&& other)
    : stdin_write_fd(other.stdin_write_fd),
      stdout_read_fd(other.stdout_read_fd),
      stderr_read_fd(other.stderr_read_fd),
      child_pid(other.child_pid),
      terminated(other.terminated),
      exit_status(other.exit_status) {
  other.stdin_write_fd = -1;
  other.stdout_read_fd = -1;
  other.stderr_read_fd = -1;
  other.child_pid = -1;
  other.terminated = true;
}